

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O0

void test_region_rgn(Am_Region *rgn1,Am_Region *rgn2,bool val1,bool val2)

{
  byte bVar1;
  char local_e8 [8];
  char error [200];
  bool total;
  bool val2_local;
  bool val1_local;
  Am_Region *rgn2_local;
  Am_Region *rgn1_local;
  
  error[0xc6] = val2;
  error[199] = val1;
  bVar1 = (**(code **)(*(long *)rgn1 + 0x20))(rgn1,rgn2,error + 0xc5);
  if (((bVar1 & 1) != (error[199] & 1U)) || ((error[0xc5] & 1U) != (error[0xc6] & 1U))) {
    sprintf(local_e8,"** test_region_rgn failed with rgn1 = %p, rgn2 = %p.\n",rgn1,rgn2);
    Am_Error(local_e8);
  }
  return;
}

Assistant:

void
test_region_rgn(Am_Region *rgn1, Am_Region *rgn2, bool val1, bool val2)
{
  bool total;
  if ((!(rgn1->In(rgn2, total) == val1)) || (!(total == val2))) {
    char error[200];
    sprintf(error, "** test_region_rgn failed with rgn1 = %p, rgn2 = %p.\n",
            rgn1, rgn2);
    Am_Error(error);
  }
}